

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plink.c
# Opt level: O0

void try_output(_Bool is_stderr)

{
  Backend *be;
  _Bool _Var1;
  int fd_00;
  bufchain *ch;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  char *__s;
  bool bVar5;
  ptrlen pVar6;
  void *local_50;
  size_t local_48;
  ptrlen senddata;
  _Bool prev_nonblock;
  ssize_t ret;
  int fd;
  bufchain *chain;
  _Bool is_stderr_local;
  
  ch = &stdout_data;
  if (is_stderr) {
    ch = &stderr_data;
  }
  fd_00 = 1;
  if (is_stderr) {
    fd_00 = 2;
  }
  sVar2 = bufchain_size(ch);
  if (sVar2 != 0) {
    _Var1 = nonblock(fd_00);
    do {
      pVar6 = bufchain_prefix(ch);
      local_50 = pVar6.ptr;
      local_48 = pVar6.len;
      sVar2 = write(fd_00,local_50,local_48);
      if (0 < (long)sVar2) {
        bufchain_consume(ch,sVar2);
      }
      bVar5 = false;
      if (sVar2 == local_48) {
        sVar3 = bufchain_size(ch);
        bVar5 = sVar3 != 0;
      }
    } while (bVar5);
    if (!_Var1) {
      no_nonblock(fd_00);
    }
    if ((long)sVar2 < 0) {
      piVar4 = __errno_location();
      if (*piVar4 != 0xb) {
        __s = "stdout: write";
        if (is_stderr) {
          __s = "stderr: write";
        }
        perror(__s);
        exit(1);
      }
    }
    be = backend;
    sVar2 = output_backlog();
    backend_unthrottle(be,sVar2);
  }
  if (outgoingeof == ADDRTYPE_IPV4) {
    sVar2 = bufchain_size(&stdout_data);
    if (sVar2 == 0) {
      close(1);
      outgoingeof = ADDRTYPE_IPV6;
    }
  }
  return;
}

Assistant:

void try_output(bool is_stderr)
{
    bufchain *chain = (is_stderr ? &stderr_data : &stdout_data);
    int fd = (is_stderr ? STDERR_FILENO : STDOUT_FILENO);
    ssize_t ret;

    if (bufchain_size(chain) > 0) {
        bool prev_nonblock = nonblock(fd);
        ptrlen senddata;
        do {
            senddata = bufchain_prefix(chain);
            ret = write(fd, senddata.ptr, senddata.len);
            if (ret > 0)
                bufchain_consume(chain, ret);
        } while (ret == senddata.len && bufchain_size(chain) != 0);
        if (!prev_nonblock)
            no_nonblock(fd);
        if (ret < 0 && errno != EAGAIN) {
            perror(is_stderr ? "stderr: write" : "stdout: write");
            exit(1);
        }

        backend_unthrottle(backend, output_backlog());
    }
    if (outgoingeof == EOF_PENDING && bufchain_size(&stdout_data) == 0) {
        close(STDOUT_FILENO);
        outgoingeof = EOF_SENT;
    }
}